

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*>::~TArray
          (TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*> *this)

{
  if (this->Array != (PClassPlayerPawn **)0x0) {
    M_Free(this->Array);
    this->Array = (PClassPlayerPawn **)0x0;
    this->Most = 0;
    this->Count = 0;
  }
  return;
}

Assistant:

~TArray ()
	{
		if (Array)
		{
			if (Count > 0)
			{
				DoDelete (0, Count-1);
			}
			M_Free (Array);
			Array = NULL;
			Count = 0;
			Most = 0;
		}
	}